

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall
Analyser_removeExternalVariableByName_Test::TestBody
          (Analyser_removeExternalVariableByName_Test *this)

{
  element_type *peVar1;
  byte bVar2;
  char *pcVar3;
  undefined8 local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_c0 [2];
  allocator<char> local_a9;
  unsigned_long local_a8 [4];
  AssertionResult gtest_ar;
  allocator<char> local_61;
  AssertionResult gtest_ar_;
  AnalyserPtr analyser;
  allocator<char> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  ModelPtr model;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",
             (allocator<char> *)&analyser);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_a8);
  local_a8[0] = 0;
  analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",local_a8,
             (unsigned_long *)&analyser);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&analyser,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1dd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&analyser,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&analyser);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Analyser::create();
  peVar1 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"membrane",(allocator<char> *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"V",local_40);
  bVar2 = libcellml::Analyser::removeExternalVariable
                    ((shared_ptr *)peVar1,(string *)&model,(string *)&gtest_ar);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,
               "analyser->removeExternalVariable(model, \"membrane\", \"V\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"membrane",&local_a9);
  libcellml::ComponentEntity::component
            ((string *)local_40,
             (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _0_1_);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"V",&local_61);
  libcellml::Component::variable((string *)&local_c8);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&gtest_ar_);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_c0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c8 = 0;
  a_Stack_c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"membrane",local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"V",&local_a9);
  bVar2 = libcellml::Analyser::removeExternalVariable
                    ((shared_ptr *)peVar1,(string *)&local_c8,(string *)&gtest_ar);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_c0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,
               "analyser->removeExternalVariable(nullptr, \"membrane\", \"V\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"X",(allocator<char> *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"V",local_40);
  bVar2 = libcellml::Analyser::removeExternalVariable
                    ((shared_ptr *)peVar1,(string *)&model,(string *)&gtest_ar);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"analyser->removeExternalVariable(model, \"X\", \"V\")"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"membrane",(allocator<char> *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"X",local_40);
  bVar2 = libcellml::Analyser::removeExternalVariable
                    ((shared_ptr *)peVar1,(string *)&model,(string *)&gtest_ar);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,
               "analyser->removeExternalVariable(model, \"membrane\", \"X\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"membrane",(allocator<char> *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"V",local_40);
  gtest_ar_.success_ =
       (bool)libcellml::Analyser::removeExternalVariable
                       ((shared_ptr *)peVar1,(string *)&model,(string *)&gtest_ar);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,
               "analyser->removeExternalVariable(model, \"membrane\", \"V\")","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"membrane",(allocator<char> *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"V",local_40);
  bVar2 = libcellml::Analyser::removeExternalVariable
                    ((shared_ptr *)peVar1,(string *)&model,(string *)&gtest_ar);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (bVar2 != 0) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,
               "analyser->removeExternalVariable(model, \"membrane\", \"V\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x1e9,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Analyser, removeExternalVariableByName)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    EXPECT_FALSE(analyser->removeExternalVariable(model, "membrane", "V"));

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V")));

    EXPECT_FALSE(analyser->removeExternalVariable(nullptr, "membrane", "V"));
    EXPECT_FALSE(analyser->removeExternalVariable(model, "X", "V"));
    EXPECT_FALSE(analyser->removeExternalVariable(model, "membrane", "X"));
    EXPECT_TRUE(analyser->removeExternalVariable(model, "membrane", "V"));
    EXPECT_FALSE(analyser->removeExternalVariable(model, "membrane", "V"));
}